

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall
QToolBarAreaLayoutInfo::insertItem(QToolBarAreaLayoutInfo *this,QToolBar *before,QLayoutItem *item)

{
  pointer pQVar1;
  QToolBar *pQVar2;
  iterator iVar3;
  long lVar4;
  int j;
  ulong uVar5;
  ulong i;
  long in_FS_OFFSET;
  undefined1 local_68 [24];
  QArrayDataPointer<QToolBarAreaLayoutItem> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (before == (QToolBar *)0x0) {
    if ((this->lines).d.size == 0) {
      local_68._16_4_ = this->o;
      local_68._0_8_ = (QLayoutItem *)0x0;
      local_68._8_4_ = -1;
      local_68._12_4_ = -1;
      local_50.d = (Data *)0x0;
      local_50.ptr = (QToolBarAreaLayoutItem *)0x0;
      local_50.size = 0;
      QList<QToolBarAreaLayoutLine>::emplaceBack<QToolBarAreaLayoutLine>
                (&this->lines,(QToolBarAreaLayoutLine *)local_68);
      QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_50);
    }
    iVar3 = QList<QToolBarAreaLayoutLine>::end(&this->lines);
    local_68._8_4_ = 0;
    local_68._12_4_ = -1;
    local_68._16_4_ = 0xffffffff;
    local_68[0x14] = false;
    local_68._0_8_ = item;
    QList<QToolBarAreaLayoutItem>::emplaceBack<QToolBarAreaLayoutItem>
              (&iVar3.i[-1].toolBarItems,(QToolBarAreaLayoutItem *)local_68);
  }
  else {
    uVar5 = 0;
    while( true ) {
      i = 0xffffffffffffffff;
      if ((ulong)(this->lines).d.size <= uVar5) break;
      pQVar1 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
      lVar4 = 0;
      while (i = i + 1, i < (ulong)pQVar1[uVar5].toolBarItems.d.size) {
        pQVar2 = (QToolBar *)
                 (**(code **)(**(long **)((long)&(pQVar1[uVar5].toolBarItems.d.ptr)->widgetItem +
                                         lVar4) + 0x68))();
        lVar4 = lVar4 + 0x18;
        if (pQVar2 == before) {
          local_68._8_4_ = 0;
          local_68._12_4_ = -1;
          local_68._16_4_ = 0xffffffff;
          local_68[0x14] = false;
          local_68._0_8_ = item;
          QList<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem>
                    (&pQVar1[uVar5].toolBarItems,i,(QToolBarAreaLayoutItem *)local_68);
          goto LAB_0046e5e6;
        }
      }
      uVar5 = uVar5 + 1;
    }
  }
LAB_0046e5e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarAreaLayoutInfo::insertItem(QToolBar *before, QLayoutItem *item)
{
    if (before == nullptr) {
        if (lines.isEmpty())
            lines.append(QToolBarAreaLayoutLine(o));
        lines.last().toolBarItems.append(item);
        return;
    }

    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            if (line.toolBarItems.at(k).widgetItem->widget() == before) {
                line.toolBarItems.insert(k, item);
                return;
            }
        }
    }
}